

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.cpp
# Opt level: O2

vector<signed_char,_std::allocator<signed_char>_> * __thiscall
single_fn::operator()
          (vector<signed_char,_std::allocator<signed_char>_> *__return_storage_ptr__,single_fn *this
          ,vector<signed_char,_std::allocator<signed_char>_> *c)

{
  ulong uVar1;
  result_type_conflict rVar2;
  pointer pcVar3;
  int iVar4;
  pointer __s;
  default_random_engine engine;
  uniform_int_distribution<unsigned_long> uniform;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_28;
  uniform_int_distribution<unsigned_long> local_20;
  
  __s = (c->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
        super__Vector_impl_data._M_start;
  pcVar3 = (c->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (1 < (ulong)((long)pcVar3 - (long)__s)) {
    uVar1 = std::random_device::_M_getval();
    iVar4 = (int)((uVar1 & 0xffffffff) % 0x7fffffff);
    local_28._M_x = (unsigned_long)(iVar4 + (uint)(iVar4 == 0));
    local_20._M_param._M_b =
         (unsigned_long)
         ((c->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
          super__Vector_impl_data._M_finish +
         ~(ulong)(c->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                 super__Vector_impl_data._M_start);
    local_20._M_param._M_a = 0;
    rVar2 = std::uniform_int_distribution<unsigned_long>::operator()(&local_20,&local_28);
    __s = (c->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
          super__Vector_impl_data._M_start;
    pcVar3 = (c->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if ((long)pcVar3 - (long)__s != 0) {
      memset(__s,(uint)(byte)__s[rVar2],(long)pcVar3 - (long)__s);
      __s = (c->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
            super__Vector_impl_data._M_start;
      pcVar3 = (c->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    }
  }
  (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
  super__Vector_impl_data._M_start = __s;
  (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
  super__Vector_impl_data._M_finish = pcVar3;
  (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (c->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (c->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (c->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (c->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Container c)
    {
        if (c.size() > 1)
        {
            std::default_random_engine engine((*rd)());
            using size_type = typename Container::size_type;
            auto uniform = std::uniform_int_distribution<size_type>(0, c.size() - 1);
            auto item = c[uniform(engine)];
            std::fill(c.begin(), c.end(), item);
        }
        return c;
    }